

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmConstant *
GetConstantArrayValue
          (ExpressionContext *ctx,SynBase *source,TypeArray *typeArray,VmInstruction *instInit)

{
  VmValueType VVar1;
  uint uVar2;
  ulong uVar3;
  TypeArray *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  VmValue **ppVVar6;
  VmConstant *pVVar7;
  VmInstruction *instInit_00;
  TypeArray *typeArray_00;
  ulong __n;
  VmValue *__src;
  ulong uVar8;
  ulong uVar9;
  char *value;
  
  if (typeArray == (TypeArray *)0x0) {
    __assert_fail("typeArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xc62,
                  "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                 );
  }
  uVar3 = (typeArray->super_TypeBase).size;
  pTVar4 = (TypeArray *)typeArray->subType;
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])();
  value = (char *)CONCAT44(extraout_var,iVar5);
  memset(value,0,uVar3 & 0xffffffff);
  if ((instInit->arguments).count != 0) {
    uVar9 = 0;
    do {
      instInit_00 = (VmInstruction *)(instInit->arguments).data[uVar9];
      if ((instInit_00->super_VmValue).typeID == 2) {
        if (instInit_00->cmd != VM_INST_ARRAY) {
          if (instInit_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
            if ((instInit_00->arguments).count == 0) {
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                           );
            }
            instInit_00 = (VmInstruction *)*(instInit_00->arguments).data;
          }
          goto LAB_002766d6;
        }
        if ((pTVar4 == (TypeArray *)0x0) ||
           (typeArray_00 = pTVar4, (pTVar4->super_TypeBase).typeID != 0x13)) {
          typeArray_00 = (TypeArray *)0x0;
        }
        pVVar7 = GetConstantArrayValue(ctx,(SynBase *)0x0,typeArray_00,instInit_00);
        __n = (pTVar4->super_TypeBase).size;
        if (__n != (pVVar7->super_VmValue).type.size) {
          __assert_fail("elementType->size == elemConst->type.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xc79,
                        "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                       );
        }
        uVar8 = __n * uVar9;
        __src = (VmValue *)pVVar7->sValue;
LAB_002767c4:
        memcpy(value + uVar8,__src,__n);
      }
      else {
LAB_002766d6:
        VVar1 = (instInit_00->super_VmValue).type.type;
        if ((int)VVar1 < 3) {
          if (VVar1 == VM_TYPE_INT) {
            if ((pTVar4->super_TypeBase).size != (ulong)(instInit_00->super_VmValue).type.size) {
              __assert_fail("elementType->size == element->type.size",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0xc83,
                            "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                           );
            }
            *(VmInstructionType *)(value + uVar9 * 4) = instInit_00->cmd;
          }
          else {
            if (VVar1 != VM_TYPE_DOUBLE) {
LAB_00276815:
              __assert_fail("!\"unknown type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0xc9b,
                            "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                           );
            }
            if (pTVar4 == (TypeArray *)ctx->typeDouble) {
              ppVVar6 = (instInit_00->arguments).data;
              goto LAB_002767d2;
            }
            if (pTVar4 != (TypeArray *)ctx->typeFloat) goto LAB_00276815;
            *(float *)(value + uVar9 * 4) = (float)(double)(instInit_00->arguments).data;
          }
        }
        else {
          if (VVar1 != VM_TYPE_LONG) {
            if ((VVar1 != VM_TYPE_STRUCT) ||
               (__src = (instInit_00->arguments).little[0], __src == (VmValue *)0x0))
            goto LAB_00276815;
            __n = (pTVar4->super_TypeBase).size;
            uVar2 = (instInit_00->super_VmValue).type.size;
            if (__n != uVar2) {
              __assert_fail("elementType->size == element->type.size",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0xc96,
                            "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                           );
            }
            uVar8 = (ulong)((int)uVar9 * uVar2);
            goto LAB_002767c4;
          }
          if ((pTVar4->super_TypeBase).size != (ulong)(instInit_00->super_VmValue).type.size) {
            __assert_fail("elementType->size == element->type.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0xc91,
                          "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                         );
          }
          ppVVar6 = *(VmValue ***)&(instInit_00->arguments).count;
LAB_002767d2:
          *(VmValue ***)(value + uVar9 * 8) = ppVVar6;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (instInit->arguments).count);
  }
  pVVar7 = CreateConstantStruct(ctx->allocator,source,value,(int)uVar3,&typeArray->super_TypeBase);
  return pVVar7;
}

Assistant:

VmConstant* GetConstantArrayValue(ExpressionContext &ctx, SynBase *source, TypeArray *typeArray, VmInstruction *instInit)
{
	assert(typeArray);

	TypeBase *elementType = typeArray->subType;

	unsigned size = unsigned(typeArray->size);

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < instInit->arguments.size(); i++)
	{
		VmValue *elementValue = instInit->arguments[i];

		if(VmInstruction *elementInst = getType<VmInstruction>(elementValue))
		{
			if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
			{
				elementValue = elementInst->arguments[0];
			}
			else if(elementInst->cmd == VM_INST_ARRAY)
			{
				VmConstant *elemConst = GetConstantArrayValue(ctx, NULL, getType<TypeArray>(elementType), elementInst);

				assert(elementType->size == elemConst->type.size);
				memcpy(value + i * elementType->size, elemConst->sValue, unsigned(elementType->size));
				continue;
			}
		}

		VmConstant *element = getType<VmConstant>(elementValue);

		if(element->type.type == VM_TYPE_INT)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * sizeof(int), &element->iValue, sizeof(int));
		}
		else if(element->type.type == VM_TYPE_DOUBLE && elementType == ctx.typeDouble)
		{
			memcpy(value + i * sizeof(double), &element->dValue, sizeof(double));
		}
		else if(element->type.type == VM_TYPE_DOUBLE && elementType == ctx.typeFloat)
		{
			float fValue = float(element->dValue);
			memcpy(value + i * sizeof(float), &fValue, sizeof(float));
		}
		else if(element->type.type == VM_TYPE_LONG)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * sizeof(long long), &element->lValue, sizeof(long long));
		}
		else if(element->type.type == VM_TYPE_STRUCT && element->sValue)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * element->type.size, element->sValue, element->type.size);
		}
		else
		{
			assert(!"unknown type");
		}
	}

	return CreateConstantStruct(ctx.allocator, source, value, size, typeArray);
}